

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parser.c
# Opt level: O2

greatest_test_res
validate_instance(Instance *instance,int32_t expected_num_customers,int32_t expected_num_vehicles)

{
  double *pdVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  if ((((instance->num_customers < 1) || (instance->num_vehicles < 1)) ||
      (instance->vehicle_cap <= 0.0)) || (pdVar1 = instance->demands, pdVar1 == (double *)0x0)) {
    greatest_info.fail_line = 0x25;
    greatest_info.msg = "is_valid_instance(instance)";
    greatest_info.assertions = greatest_info.assertions + 1;
  }
  else if (instance->num_customers == expected_num_customers) {
    if (instance->num_vehicles == expected_num_vehicles) {
      if (instance->vehicle_cap <= 0.0) {
        greatest_info.fail_line = 0x28;
        greatest_info.msg = "instance->vehicle_cap > 0";
        greatest_info.assertions = greatest_info.assertions + 4;
      }
      else if (instance->positions == (Vec2d *)0x0) {
        greatest_info.fail_line = 0x2a;
        greatest_info.msg = "instance->positions";
        greatest_info.assertions = greatest_info.assertions + 5;
      }
      else if (instance->profits == (double *)0x0) {
        greatest_info.fail_line = 0x2c;
        greatest_info.msg = "instance->profits";
        greatest_info.assertions = greatest_info.assertions + 7;
      }
      else if ((*pdVar1 != 0.0) || (NAN(*pdVar1))) {
        greatest_info.fail_line = 0x2e;
        greatest_info.msg = "instance->demands[0] == 0.0";
        greatest_info.assertions = greatest_info.assertions + 8;
      }
      else {
        iVar3 = greatest_info.assertions + 9;
        uVar4 = 0;
        greatest_info.assertions = greatest_info.assertions + 8;
        do {
          if ((uint)expected_num_customers == uVar4) {
            greatest_info.msg = (char *)0x0;
            return GREATEST_TEST_RES_PASS;
          }
          greatest_info.assertions = iVar3 + (int)uVar4;
          lVar2 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while (0.0 < pdVar1[lVar2]);
        greatest_info.fail_line = 0x30;
        greatest_info.msg = "instance->demands[i] > 0.0";
      }
    }
    else {
      greatest_info.fail_line = 0x27;
      greatest_info.msg = "instance->num_vehicles != expected_num_vehicles";
      greatest_info.assertions = greatest_info.assertions + 3;
    }
  }
  else {
    greatest_info.fail_line = 0x26;
    greatest_info.msg = "instance->num_customers != expected_num_customers";
    greatest_info.assertions = greatest_info.assertions + 2;
  }
  greatest_info.fail_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
  ;
  if ((greatest_info.flags & 4) == 0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-parser.c"
    ;
    return GREATEST_TEST_RES_FAIL;
  }
  abort();
}

Assistant:

TEST validate_instance(Instance *instance, int32_t expected_num_customers,
                       int32_t expected_num_vehicles) {
    ASSERT(is_valid_instance(instance));
    ASSERT_EQ(instance->num_customers, expected_num_customers);
    ASSERT_EQ(instance->num_vehicles, expected_num_vehicles);
    ASSERT(instance->vehicle_cap > 0);

    ASSERT(instance->positions);
    ASSERT(instance->demands);
    ASSERT(instance->profits);

    ASSERT(instance->demands[0] == 0.0);
    for (int32_t i = 1; i < instance->num_customers + 1; i++)
        ASSERT(instance->demands[i] > 0.0);

    // TODO: __EMAIL the professor__
    //       Double check these assertions. For some reason there are instances
    //       where the depot doesn't have a dual = 0, and some customers have
    //       duals which are negative. Therefore not all instances pass these
    //       checks. For this reason these checks are currently disabled
    if (0) {
        ASSERT(instance->profits[0] == 0.0);
        for (int32_t i = 1; i < instance->num_customers + 1; i++)
            ASSERT(instance->profits[i] >= 0.0);
    }

    PASS();
}